

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O0

HT_FeatureCallstack * HT_FeatureCallstack_alloc(void)

{
  HT_FeatureCallstack *pHVar1;
  HT_FeatureKlass *pHVar2;
  HT_FeatureCallstack *feature;
  
  pHVar1 = (HT_FeatureCallstack *)ht_alloc(0x48);
  if (pHVar1 != (HT_FeatureCallstack *)0x0) {
    pHVar2 = HT_FeatureCallstack_get_class();
    (pHVar1->base).klass = pHVar2;
  }
  return pHVar1;
}

Assistant:

static HT_Feature*
ht_feature_callstack_create(HT_ErrorCode* out_err)
{
    HT_FeatureCallstack* feature = HT_FeatureCallstack_alloc();
    HT_ErrorCode error_code = HT_ERR_OK;

    if (feature == NULL)
    {
        HT_SET_ERROR(out_err, HT_ERR_OUT_OF_MEMORY);
        return NULL;
    }

    error_code = ht_stack_init(&feature->stack, 1024, 32);

    if (error_code != HT_ERR_OK)
    {
        ht_free(feature);
        feature = NULL;
    }

    HT_SET_ERROR(out_err, error_code);

    return (HT_Feature*)feature;
}